

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void WindowSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  void *pvVar1;
  char *pcVar2;
  ImGuiContext *g;
  ImGuiStorage *this;
  ImGuiID *pIVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  
  pcVar2 = (ctx->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar3 = (ImGuiID *)(pcVar2 + 4);
    this = &GImGui->WindowsById;
    do {
      if (*(char *)((long)pIVar3 + 0xd) == '\x01') {
        pvVar1 = ImGuiStorage::GetVoidPtr(this,*pIVar3);
        if (pvVar1 != (void *)0x0) {
          auVar5 = pshuflw(ZEXT416(pIVar3[1]),ZEXT416(pIVar3[1]),0x60);
          *(ulong *)((long)pvVar1 + 0x18) =
               CONCAT44((float)(auVar5._4_4_ >> 0x10),(float)(auVar5._0_4_ >> 0x10));
          if ((0 < (short)(ushort)pIVar3[2]) && (0 < (short)*(ushort *)((long)pIVar3 + 10))) {
            uVar4 = CONCAT44((float)*(ushort *)((long)pIVar3 + 10),(float)(ushort)pIVar3[2]);
            *(undefined8 *)((long)pvVar1 + 0x20) = uVar4;
            *(undefined8 *)((long)pvVar1 + 0x28) = uVar4;
          }
          *(char *)((long)pvVar1 + 0x99) = (char)pIVar3[3];
        }
        *(undefined1 *)((long)pIVar3 + 0xd) = 0;
        pcVar2 = (ctx->SettingsWindows).Buf.Data;
      }
      pIVar3 = (ImGuiID *)((long)pIVar3 + (long)(int)pIVar3[-1]);
    } while (pIVar3 != (ImGuiID *)(pcVar2 + (long)(ctx->SettingsWindows).Buf.Size + 4));
  }
  return;
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }